

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O1

int forkal(int ip,int iq,int id,double *phi,double *theta,double *delta,int N,double *W,
          double *resid,int il,double *Y,double *AMSE)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  ulong uVar6;
  double *pdVar7;
  int iVar8;
  long lVar9;
  undefined4 in_register_00000034;
  double *pdVar10;
  int iVar11;
  undefined4 in_register_0000003c;
  long lVar12;
  int iVar13;
  long lVar14;
  double *pdVar15;
  long lVar16;
  uint uVar17;
  size_t sVar18;
  int iVar19;
  ulong uVar20;
  double *pdVar21;
  long lVar22;
  double *pdVar23;
  uint uVar24;
  bool bVar25;
  double dVar26;
  double extraout_XMM0_Qa;
  double dVar27;
  double dVar28;
  double local_1d8;
  double sumlog;
  double ssq;
  int nit;
  int iter;
  long local_1b8;
  double local_1b0;
  long local_1a8;
  size_t local_1a0;
  long local_198;
  size_t local_190;
  double *local_188;
  long local_180;
  long local_178;
  double *local_170;
  long local_168;
  double *local_160;
  double *local_158;
  size_t local_150;
  long local_148;
  long local_140;
  ulong local_138;
  ulong local_130;
  double *local_128;
  double *local_120;
  long local_118;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  double *local_f8;
  ulong local_f0;
  double *local_e8;
  double *local_e0;
  ulong local_d8;
  long local_d0;
  ulong local_c8;
  undefined8 local_c0;
  void *local_b8;
  undefined8 local_b0;
  ulong local_a8;
  long local_a0;
  ulong local_98;
  ulong local_90;
  double *local_88;
  double local_80;
  double *local_78;
  int local_6c;
  double *local_68;
  ulong local_60;
  long local_58;
  double *local_50;
  void *local_48;
  int local_40;
  char local_39;
  ulong local_38;
  
  local_c0 = CONCAT44(in_register_0000003c,ip);
  local_b0 = CONCAT44(in_register_00000034,iq);
  local_f0 = (ulong)(uint)il;
  uVar24 = iq + 1U;
  if ((int)(iq + 1U) <= ip) {
    uVar24 = ip;
  }
  local_38 = (ulong)uVar24;
  iVar3 = 4;
  if (iq * iq != 0 || ip * ip != 0) {
    iVar3 = (iq >> 0x1f) * -2 - (ip >> 0x1f);
  }
  iVar19 = 8;
  if (-1 < id) {
    iVar19 = iVar3;
  }
  local_fc = 0xb;
  if (0 < il) {
    local_fc = iVar19;
  }
  if (local_fc == 0) {
    local_6c = uVar24 + 1;
    local_d8 = CONCAT44(local_d8._4_4_,local_6c * uVar24);
    uVar17 = (int)(local_6c * uVar24) / 2;
    iVar3 = uVar24 + id;
    local_40 = uVar24 + id + 1;
    local_58 = CONCAT44(local_58._4_4_,local_40 * iVar3);
    uVar24 = (local_40 * iVar3) / 2;
    lVar9 = (long)iVar3;
    local_e0 = delta;
    local_88 = phi;
    local_68 = theta;
    local_78 = (double *)malloc(lVar9 * 8);
    local_90 = (ulong)uVar24;
    local_50 = (double *)malloc((long)(int)uVar24 << 3);
    sVar18 = (long)(int)uVar17 << 3;
    local_a8 = (ulong)uVar17;
    local_f8 = (double *)malloc(sVar18);
    pvVar5 = malloc(lVar9 * 8);
    pdVar23 = local_78;
    local_b8 = malloc(sVar18);
    local_d0 = lVar9;
    if (0 < iVar3) {
      sVar18 = (ulong)(((int)local_38 + id) - 1) * 8 + 8;
      memset(pdVar23,0,sVar18);
      memset(pvVar5,0,sVar18);
    }
    local_60 = (ulong)(uint)id;
    local_48 = pvVar5;
    if (1 < (int)local_58) {
      memset(local_50,0,(ulong)((int)local_90 - 1) * 8 + 8);
    }
    pdVar23 = local_f8;
    if (1 < (int)local_d8) {
      sVar18 = (ulong)((int)local_a8 - 1) * 8 + 8;
      memset(local_f8,0,sVar18);
      memset(local_b8,0,sVar18);
    }
    *local_78 = 0.0;
    *pdVar23 = 1.0;
    if ((int)local_38 == 1) {
      dVar26 = *local_88 * *local_88;
      *local_50 = 1.0 / (1.0 - dVar26);
    }
    else {
      starma((int)local_c0,(int)local_b0,local_88,local_68,local_78,local_50,pdVar23);
      dVar26 = extraout_XMM0_Qa;
    }
    iVar3 = (int)local_60;
    uVar24 = N - iVar3;
    local_98 = local_60 & 0xffffffff;
    if (iVar3 != 0) {
      if (0 < iVar3) {
        iVar19 = N + -2;
        uVar6 = 0;
        do {
          dVar26 = W[iVar19];
          *(double *)((long)local_48 + uVar6 * 8) = dVar26;
          iVar19 = iVar19 + -1;
          uVar6 = uVar6 + 1;
        } while (local_98 != uVar6);
      }
      if (0 < (int)uVar24) {
        pdVar10 = W + iVar3;
        uVar6 = 1;
        do {
          if (iVar3 < 1) {
            dVar26 = 0.0;
          }
          else {
            dVar26 = 0.0;
            lVar9 = -1;
            pdVar15 = local_e0;
            do {
              dVar26 = dVar26 - *pdVar15 * pdVar10[lVar9];
              pdVar15 = pdVar15 + 1;
              lVar9 = lVar9 + -1;
            } while (-lVar9 != (ulong)(iVar3 + 1));
          }
          dVar26 = dVar26 + W[(long)iVar3 + (uVar6 - 1)];
          W[uVar6 - 1] = dVar26;
          uVar6 = uVar6 + 1;
          pdVar10 = pdVar10 + 1;
        } while (uVar6 != uVar24 + 1);
      }
    }
    sumlog = 0.0;
    local_1d8 = 0.0;
    ssq._0_4_ = 0;
    ssq._4_4_ = 0;
    karma((int)local_c0,(int)local_b0,local_88,local_68,local_78,local_50,pdVar23,uVar24,W,resid,
          &local_1d8,&sumlog,1,dVar26,(int *)((long)&ssq + 4),(int *)&ssq);
    pdVar23 = local_50;
    if ((int)uVar24 < 1) {
      dVar26 = 0.0;
    }
    else {
      dVar26 = 0.0;
      uVar6 = 0;
      do {
        dVar26 = dVar26 + resid[uVar6] * resid[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar24 != uVar6);
    }
    local_68 = (double *)(long)local_6c;
    local_c8 = local_38 & 0xffffffff;
    pdVar10 = local_88;
    if ((int)local_60 != 0) {
      local_80 = dVar26;
      if (1 < (int)local_d8) {
        memcpy(local_b8,local_50,(ulong)((int)local_a8 - 1) * 8 + 8);
      }
      if (1 < (int)local_58) {
        memset(pdVar23,0,(ulong)((int)local_90 - 1) * 8 + 8);
      }
      if (0 < (int)local_38) {
        uVar6 = 0;
        iVar3 = 1;
        uVar20 = local_38 & 0xffffffff;
        iVar19 = 0;
        do {
          memcpy(local_50 + ((iVar3 + -1) * local_40 - ((iVar3 + -1) * iVar3) / 2),
                 (void *)((long)local_b8 + (long)iVar19 * 8),
                 (ulong)(~(uint)uVar6 + (int)local_38) * 8 + 8);
          iVar4 = 0;
          do {
            iVar4 = iVar4 + -1;
          } while ((int)uVar20 + iVar4 != 0);
          iVar19 = iVar19 - iVar4;
          iVar3 = iVar3 + 1;
          uVar6 = uVar6 + 1;
          uVar20 = (ulong)((int)uVar20 - 1);
        } while (uVar6 != local_c8);
      }
      pdVar23 = local_50;
      pdVar10 = local_88;
      dVar26 = local_80;
      if (0 < (int)local_60) {
        memcpy(local_78 + ((long)local_68 - 1),local_48,local_98 * 8);
        dVar26 = local_80;
      }
    }
    if (0 < il) {
      dVar26 = dVar26 / (double)(int)uVar24;
      iVar3 = (int)local_d0;
      local_138 = (ulong)(uint)(iVar3 * 2);
      iVar4 = iVar3 * 2 + 1;
      local_110 = (int)local_60;
      iVar19 = (int)local_38;
      iVar13 = ((iVar19 + local_110 * 2 + 1) * iVar19) / 2;
      local_6c = iVar3 * 2 + 2;
      local_b0 = CONCAT44(local_b0._4_4_,iVar4);
      local_a8 = CONCAT44(local_a8._4_4_,((iVar4 - iVar19) * iVar19) / 2);
      local_190 = (ulong)(iVar19 - 1) << 3;
      local_158 = pdVar23 + ((long)local_68 - 1);
      local_f0 = (ulong)((int)local_f0 + 1);
      local_68 = (double *)((ulong)local_68 & 0xffffffff);
      local_39 = iVar19 < 1 || local_110 == 1;
      local_1b8 = (ulong)((int)local_c0 + 1) - 1;
      local_120 = local_78 + local_d0;
      local_118 = -local_98;
      local_1a8 = (long)local_48 + 8;
      local_10c = local_110 * 2 + 1;
      local_104 = local_110 * 2 + 1;
      local_90 = CONCAT44(local_90._4_4_,local_110 * 2 + 2);
      local_58 = (long)iVar19;
      local_d0 = CONCAT44(local_d0._4_4_,iVar13);
      local_180 = (long)iVar13;
      local_188 = local_78 + 1;
      local_d8 = (ulong)(local_110 + 1);
      local_150 = local_98 * 8;
      local_100 = iVar19 + 2 + local_110;
      local_1a0 = local_c8 * 8;
      local_128 = local_78 + local_58;
      local_a0 = local_d8 - 1;
      local_e8 = pdVar23 + local_58;
      local_148 = local_180 + 1;
      local_140 = local_98 - 1;
      _nit = pdVar23 + -2;
      local_110 = local_110 + -1;
      local_108 = iVar3 * 2 - 1;
      local_178 = (long)local_68 - 1;
      local_198 = local_c8 - 1;
      local_170 = local_e0 + 1;
      local_168 = local_d8 - 2;
      local_160 = pdVar23 + 1;
      uVar6 = 1;
      pdVar15 = local_e0;
      local_80 = dVar26;
      do {
        uVar20 = local_60;
        iVar3 = (int)local_38;
        dVar27 = *local_78;
        local_130 = uVar6;
        if (1 < iVar3) {
          local_1b0 = *local_78;
          memmove(local_78,local_188,local_190);
          iVar3 = (int)local_38;
          dVar27 = local_1b0;
          dVar26 = local_80;
        }
        local_78[local_58 + -1] = 0.0;
        if (0 < (int)local_c0) {
          lVar9 = 0;
          do {
            local_78[lVar9] = pdVar10[lVar9] * dVar27 + local_78[lVar9];
            lVar9 = lVar9 + 1;
          } while (local_1b8 != lVar9);
        }
        iVar19 = (int)uVar20;
        if (iVar19 != 0) {
          if (0 < iVar19) {
            lVar9 = 0;
            do {
              dVar27 = dVar27 + pdVar15[lVar9] * local_128[lVar9];
              lVar9 = lVar9 + 1;
            } while (local_a0 != lVar9);
          }
          if (1 < iVar19) {
            lVar9 = -1;
            do {
              local_120[lVar9] = local_120[lVar9 + -1];
              lVar9 = lVar9 + -1;
            } while (local_118 != lVar9);
          }
          local_78[local_58] = dVar27;
          if (iVar19 != 0) {
            if (0 < iVar19) {
              uVar6 = 1;
              do {
                *(undefined8 *)((long)local_48 + uVar6 * 8 + -8) = 0;
                uVar20 = 1;
                iVar3 = (int)local_d0;
                iVar19 = (int)local_90;
                do {
                  iVar4 = imax((int)uVar6,(int)uVar20);
                  iVar13 = imin((int)uVar6,(int)uVar20);
                  *(double *)((long)local_48 + uVar6 * 8 + -8) =
                       local_e0[uVar20 - 1] *
                       local_50[((iVar4 + iVar3) - iVar13) + ((iVar19 - iVar13) * (iVar13 + -1)) / 2
                               ] + *(double *)((long)local_48 + uVar6 * 8 + -8);
                  uVar20 = uVar20 + 1;
                } while (local_d8 != uVar20);
                uVar6 = uVar6 + 1;
              } while (uVar6 != local_d8);
            }
            pdVar23 = local_50;
            pdVar10 = local_88;
            pdVar15 = local_e0;
            iVar19 = (int)local_60;
            iVar3 = (int)local_38;
            if (iVar19 != 1) {
              if (1 < iVar19) {
                iVar13 = 1;
                iVar4 = 2;
                do {
                  iVar8 = iVar19 - iVar13;
                  lVar9 = 0;
                  do {
                    local_50[(((local_104 - iVar8) * iVar8) / 2 + (int)local_d0) + lVar9] =
                         local_50[((((int)local_90 - iVar8) * (iVar8 + -1)) / 2 + (int)local_d0) +
                                  lVar9];
                    lVar9 = lVar9 + 1;
                  } while (iVar13 != (int)lVar9);
                  iVar13 = iVar13 + 1;
                  bVar25 = iVar4 != iVar19;
                  iVar4 = iVar4 + 1;
                } while (bVar25);
              }
              if (1 < iVar19) {
                lVar9 = 0;
                do {
                  local_50[(int)local_148 + (int)lVar9] =
                       *(double *)((long)local_48 + lVar9 * 8) + local_e8[lVar9];
                  lVar9 = lVar9 + 1;
                } while (local_140 != lVar9);
              }
            }
            local_50[local_180] = *local_50;
            if (0 < iVar19) {
              dVar26 = local_50[local_180];
              lVar9 = 0;
              do {
                dVar26 = dVar26 + (local_e8[lVar9] + local_e8[lVar9] +
                                  *(double *)((long)local_48 + lVar9 * 8)) * local_e0[lVar9];
                local_50[local_180] = dVar26;
                lVar9 = lVar9 + 1;
              } while (local_a0 != lVar9);
            }
            if (0 < iVar19) {
              memcpy(local_48,local_158,local_150);
              iVar3 = (int)local_38;
            }
            if (0 < iVar3) {
              uVar6 = 1;
              do {
                if (0 < iVar19) {
                  uVar24 = (uint)uVar6;
                  iVar4 = (int)((uVar24 - 1) * ((int)local_138 - uVar24)) / 2 + iVar3;
                  dVar26 = pdVar10[uVar6 - 1];
                  lVar9 = 0;
                  do {
                    dVar27 = *(double *)((long)local_48 + lVar9 * 8) * dVar26;
                    pdVar23[iVar4 + lVar9] = dVar27;
                    if (uVar6 != local_c8) {
                      pdVar23[iVar4 + lVar9] =
                           dVar27 + pdVar23[((int)((~uVar24 + (int)local_138) * uVar24) / 2 + iVar3)
                                            + lVar9];
                    }
                    lVar9 = lVar9 + 1;
                  } while (local_a0 != lVar9);
                }
                uVar6 = uVar6 + 1;
              } while ((double *)uVar6 != local_68);
            }
            if (0 < iVar3) {
              uVar6 = 1;
              do {
                *(undefined8 *)((long)local_48 + uVar6 * 8 + -8) = 0;
                if (0 < iVar19) {
                  dVar26 = *(double *)((long)local_48 + uVar6 * 8 + -8);
                  lVar9 = 0;
                  do {
                    dVar26 = dVar26 + pdVar15[lVar9] *
                                      pdVar23[((((int)local_b0 - (int)uVar6) * (int)uVar6) / 2 -
                                              iVar19) + lVar9];
                    lVar9 = lVar9 + 1;
                  } while (local_a0 != lVar9);
                  *(double *)((long)local_48 + uVar6 * 8 + -8) = dVar26;
                }
                uVar6 = uVar6 + 1;
              } while ((double *)uVar6 != local_68);
            }
            if (local_39 == '\0') {
              iVar8 = 4;
              uVar6 = 2;
              iVar4 = local_100;
              iVar13 = 1;
              do {
                if (1 < iVar19) {
                  pdVar7 = _nit + (iVar4 - (int)(uVar6 >> 1));
                  iVar11 = local_110;
                  do {
                    *pdVar7 = pdVar7[-1];
                    pdVar7 = pdVar7 + -1;
                    iVar11 = iVar11 + -1;
                  } while (iVar11 != 0);
                }
                iVar4 = iVar4 + local_40;
                uVar6 = (ulong)(uint)((int)uVar6 + iVar8);
                iVar8 = iVar8 + 2;
                bVar25 = iVar13 != iVar3;
                iVar13 = iVar13 + 1;
              } while (bVar25);
            }
            dVar26 = local_80;
            if (0 < iVar3) {
              lVar9 = 0;
              iVar19 = local_108;
              do {
                lVar12 = lVar9 + 1;
                dVar27 = pdVar10[lVar9] * *pdVar23 + *(double *)((long)local_48 + lVar9 * 8);
                iVar4 = ((int)lVar9 * iVar19) / 2 + iVar3;
                pdVar23[iVar4] = dVar27;
                if (lVar12 < local_58) {
                  pdVar23[iVar4] = dVar27 + pdVar23[lVar9 + 1];
                }
                iVar19 = iVar19 + -1;
                lVar9 = lVar12;
              } while (local_178 != lVar12);
            }
          }
        }
        if (0 < iVar3) {
          memcpy(local_48,pdVar23,local_1a0);
          iVar3 = (int)local_38;
          dVar26 = local_80;
        }
        if (0 < iVar3) {
          dVar27 = *pdVar23;
          iVar3 = 0;
          uVar6 = 1;
          pdVar7 = pdVar10;
          lVar9 = local_1a8;
          lVar12 = local_198;
          lVar14 = local_58;
          pdVar21 = pdVar23;
          do {
            iVar19 = (int)uVar6;
            dVar1 = pdVar10[uVar6 - 1];
            iVar4 = ((iVar19 + -1) * (local_6c - iVar19)) / 2;
            iVar19 = (((int)local_b0 - iVar19) * iVar19) / 2;
            lVar16 = 0;
            pdVar23 = pdVar21;
            do {
              dVar2 = pdVar7[lVar16];
              dVar28 = dVar2 * dVar27 * dVar1 + local_f8[iVar3 + lVar16];
              pdVar21[iVar4 + lVar16] = dVar28;
              if ((long)uVar6 < local_58) {
                pdVar21[iVar4 + lVar16] = dVar2 * *(double *)((long)local_48 + uVar6 * 8) + dVar28;
              }
              if (lVar12 != lVar16) {
                lVar22 = (long)iVar19;
                iVar19 = iVar19 + 1;
                pdVar21[iVar4 + lVar16] =
                     *(double *)(lVar9 + lVar16 * 8) * dVar1 + local_50[lVar22] +
                     pdVar21[iVar4 + lVar16];
                pdVar23 = local_50;
              }
              lVar16 = lVar16 + 1;
            } while ((int)lVar14 != (int)lVar16);
            iVar3 = iVar3 + (int)lVar16;
            uVar6 = uVar6 + 1;
            lVar14 = lVar14 + -1;
            lVar12 = lVar12 + -1;
            lVar9 = lVar9 + 8;
            pdVar7 = pdVar7 + 1;
            pdVar21 = pdVar23;
          } while ((double *)uVar6 != local_68);
        }
        Y[local_130 - 1] = *local_78;
        iVar3 = (int)local_60;
        if (0 < iVar3) {
          dVar27 = Y[local_130 - 1];
          lVar9 = 0;
          do {
            dVar27 = dVar27 + local_128[lVar9] * pdVar15[lVar9];
            Y[local_130 - 1] = dVar27;
            lVar9 = lVar9 + 1;
          } while (local_a0 != lVar9);
        }
        dVar27 = *pdVar23;
        if (iVar3 != 0) {
          if (0 < iVar3) {
            lVar9 = 0;
            iVar19 = local_10c;
            do {
              dVar1 = pdVar15[lVar9];
              dVar27 = dVar27 + (dVar1 + dVar1) * local_e8[lVar9] +
                                pdVar23[((int)lVar9 * iVar19) / 2 + (int)local_a8] * dVar1 * dVar1;
              lVar9 = lVar9 + 1;
              iVar19 = iVar19 + -1;
            } while (local_a0 != lVar9);
          }
          if (1 < iVar3) {
            uVar6 = 1;
            lVar9 = local_168;
            pdVar7 = local_170;
            do {
              iVar3 = (int)uVar6;
              lVar12 = uVar6 - 1;
              uVar6 = uVar6 + 1;
              lVar14 = 0;
              do {
                dVar27 = dVar27 + (pdVar7[lVar14] + pdVar7[lVar14]) * pdVar15[lVar12] *
                                  local_160[(((iVar3 + -1) * ((int)local_90 - iVar3)) / 2 +
                                            (int)local_a8) + lVar14];
                lVar14 = lVar14 + 1;
              } while (lVar9 != lVar14);
              pdVar7 = pdVar7 + 1;
              lVar9 = lVar9 + -1;
            } while (uVar6 != local_98);
          }
        }
        AMSE[local_130 - 1] = dVar27 * dVar26;
        uVar6 = local_130 + 1;
      } while (uVar6 != local_f0);
    }
    pvVar5 = local_48;
    free(local_78);
    free(pdVar23);
    free(local_f8);
    free(pvVar5);
    free(local_b8);
  }
  return local_fc;
}

Assistant:

int forkal(int ip,int iq,int id,double *phi,double*theta,double *delta,int N,double *W,double *resid,int il,double *Y,double *AMSE) {
	int ifault,ir,np,k,nrbar,ird,irz;
	double *A,*P,*V,*store,*xrow;
	double zero, one, two,AA,del,sumlog,ssq,sigma,A1,dt,phij,phijdt,phii,AMS;
	int i,  j, ll, nt, nj, idk, iid,iupd,nit,iter,ind,irj;
	int ir2, ir1, id2r, id2r1, id1,idd1,idd2,i45,idrr1,iddr,jkl,jkl1,id2r2,ibc,l,iri1,jj;
	int lk, lk1,jklj,iri,kk1,k1,kk,kkk,ind1,ind2,jrj,j1,jrk;
	/*
C     C Translation of Fortran routine
C     ALGORITHM AS 182  APPL. STATIST. (1982) VOL.31, NO.2
C
C     Finite sample prediction from ARIMA processes.
C
C     Auxiliary routines required: KARMA & STARMA from AS 154 and
C     routines called by them: INCLU2 from ASR 17 (a slight variant on
C     AS 75, and REGRES from AS 75.
C*/
	ir = iq + 1;

	if (ir < ip) {
		ir = ip;
	}
	np = (ir * (ir + 1)) / 2;
	nrbar = (np * (np - 1)) / 2;
	ird = ir + id;
	irz = (ird * (ird + 1)) / 2;
	zero = 0.0;
	one = 1.0;
	two = 2.0;

	ifault = 0;

	if (ip < 0) {
		ifault = 1;
	}
	if (iq < 0) {
		ifault = ifault + 2;
	}
	if (ip*ip + iq*iq == 0) {
		ifault = 4;
	}
	if (id < 0) {
		ifault = 8;
	}
	if (il < 1) {
		ifault = 11;
	}
	if (ifault != 0) {
		return ifault;
	}

	A = (double*)malloc(sizeof(double)* ird);
	P = (double*)malloc(sizeof(double)* irz);
	V = (double*)malloc(sizeof(double)* np); 
	store = (double*)malloc(sizeof(double)* ird);
	xrow = (double*)malloc(sizeof(double)* np);

	//Initial Conditions for Kalman Filter

	for (i = 0; i < ird; ++i) {
		A[i] = zero;
		store[i] = zero;
	}
	for (i = 0; i < irz; ++i) {
		P[i] = zero;
	}
	for (i = 0; i < np; ++i) {
		V[i] = zero;
		xrow[i] = zero;
	}
	A[0] = zero;
	V[0] = one;
	/*

	if (np != 1) {
		for (i = 2; i <= np; ++i) {
			V[i-1] = zero;
		}
		if (iq != 0) {
			iq1 = iq + 1;
			for (i = 2; i <= iq1; ++i) {
				V[i-1] = theta[i - 2];
			}
			for (j = 1; j <= iq; ++j) {
				ll = j * (2 * ir + 1 - j) / 2;
				for (i = j; i <= iq; ++i) {
					lli = ll + i;
					V[lli-1] = theta[i-1] * theta[j-1]; // Error
				}
			}
		}
	}//130
*/
	//Find initial likelihood conditions.

	if (ir == 1) {
		*P = 1.0 / (1.0 - phi[0] * phi[0]);
	}
	else {
		starma(ip, iq, phi, theta,A, P, V);
	}

	//Calculate Data Transformations

	nt = N - id;

	if (id != 0) {
		for (j = 1; j <= id; ++j) {
			nj = N - j;
			store[j-1] = W[nj-1];
		}
		for (i = 1; i <= nt; ++i) {
			AA = zero;
			for (k = 1; k <= id; ++k) {
				idk = id + i - k;
				AA -= delta[k - 1] * W[idk - 1];
			}
			iid = i + id;
			W[i - 1] = W[iid - 1] + AA;
		}
	}//170

	//Evaluate likelihood to obtain final KF conditions
	sumlog = ssq = zero;
	del = -1.0;
	iupd = 1;
	nit = 0;
	iter = 0;

	karma(ip, iq, phi, theta, A, P, V, nt, W, resid, &sumlog, &ssq, iupd, del,&iter, &nit);

	//Calculate M.L.E. of sigma squared

	sigma = zero;

	for (j = 0; j < nt; ++j) {
		sigma += resid[j] * resid[j];
	}
	sigma = sigma / nt;
	//mdisplay(resid, 1, N);

	//Reset the initial A and P when differencing occurs

	if (id != 0) {
		for (i = 1; i <= np; ++i) {
			xrow[i-1] = P[i-1];
		}
		for (i = 1; i <= irz; ++i) {
			P[i-1] = zero;
		}
		ind = 0;
		for (j = 1; j <= ir; ++j) {
			k = (j - 1) * (id + ir + 1) - (j - 1) * j / 2;
			for (i = j; i <= ir; ++i) {
				ind++;
				k++;
				P[k - 1] = xrow[ind-1];
			}
		}

		for (j = 1; j <= id; ++j) {
			irj = ir + j;
			A[irj-1] = store[j-1];
		}

	}//250

	//Set up constants
	ir2 = ir + 1;
	ir1 = ir - 1;
	id1 = id - 1;
	id2r = 2 * ird;
	id2r1 = id2r - 1;
	idd1 = 2 * id + 1;
	idd2 = idd1 + 1;
	i45 = id2r + 1;
	idrr1 = ird + 1;
	iddr = 2 * id + ir;
	jkl = ir * (iddr + 1) / 2;
	jkl1 = jkl + 1;
	id2r2 = id2r + 2;
	ibc = ir * (i45 - ir) / 2;

	for (l = 1; l <= il; ++l) {
		//Predict A
		A1 = A[0];
		if (ir != 1) {
			for (i = 1; i <= ir1; ++i) {
				A[i-1] = A[i];
			}
		}//310
		A[ir-1] = zero;
		if (ip != 0) {
			for (j = 1; j <= ip; ++j) {
				A[j-1] += phi[j-1] * A1;
			}
		}//330
		if (id != 0) {
			for (j = 1; j <= id; ++j) {
				irj = ir + j;
				A1 += delta[j-1] * A[irj-1];
			}//340
			if (id >= 2) {
				for (i = 1; i <= id1; ++i) {
					iri1 = ird - i;
					A[iri1] = A[iri1-1];
				}
			}//360
			A[ir2 - 1] = A1;
		}//360

		//A[ir2-1] = A1;

		//Predict P

		if (id != 0) {
			for (i = 1; i <= id; ++i) {
				store[i-1] = zero;
				for (j = 1; j <= id; ++j) {
					ll = imax(i, j);
					k = imin(i, j);
					jj = jkl + (ll - k) + 1 + (k - 1) * (idd2 - k) / 2;
					store[i-1] += delta[j-1] * P[jj-1];
				}
			}//370

			if (id != 1) {
				for (j = 1; j <= id1; ++j) {
					jj = id - j;
					lk = (jj - 1) * (idd2 - jj) / 2 + jkl;
					lk1 = jj * (idd1 - jj) / 2 + jkl;
					for (i = 1; i <= j; ++i) {
						lk = lk + 1;
						lk1 = lk1 + 1;
						P[lk1-1] = P[lk-1];
					}
				}//380
				for (j = 1; j <= id1; ++j) {
					jklj = jkl1 + j;
					irj = ir + j;
					P[jklj - 1] = store[j - 1] + P[irj-1];
				}
			}//400

			P[jkl1 - 1] = P[0];

			for (i = 1; i <= id; ++i) {
				iri = ir + i;
				P[jkl1 - 1] += delta[i - 1] * (store[i - 1] + two * P[iri - 1]);
			}

			for (i = 1; i <= id; ++i) {
				iri = ir + i;
				store[i - 1] = P[iri - 1];
			}

			for (j = 1; j <= ir; ++j) {
				kk1 = j * (id2r1 - j) / 2 + ir;
				k1 = (j - 1) * (id2r - j) / 2 + ir;
				for (i = 1; i <= id; ++i) {
					kk = kk1 + i;
					k = k1 + i;
					P[k - 1] = phi[j - 1] * store[i - 1];
					if (j != ir) {
						P[k - 1] += P[kk - 1];
					}
				}
			}

			for (j = 1; j <= ir; ++j) {
				store[j - 1] = zero;
				kkk = j * (i45 - j) / 2 - id;
				for (i = 1; i <= id; ++i) {
					kkk++;
					store[j - 1] += delta[i - 1] * P[kkk - 1];
				}
			}//440

			if (id != 1) {
				for (j = 1; j <= ir; ++j) {
					k = j * idrr1 - j * (j + 1) / 2 + 1;
					for (i = 1; i <= id1; ++i) {
						k--;
						P[k - 1] = P[k - 2];
					}
				}
			}//460

			for (j = 1; j <= ir; ++j) {
				k = (j - 1) * (id2r - j) / 2 + ir + 1;
				P[k - 1] = store[j - 1] + phi[j - 1] * P[0];
				if (j < ir) {
					P[k - 1] += P[j];
				}
			}

		}//480

		for (i = 0; i < ir; ++i) {
			store[i] = P[i];
		}

		ind = 0;
		dt = P[0];
		for (j = 1; j <= ir; ++j) {
			phij = phi[j - 1];
			phijdt = phij * dt;
			ind2 = (j - 1) * (id2r2 - j) / 2;
			ind1 = j * (i45 - j) / 2;
			for (i = j; i <= ir; ++i) {
				ind++;
				ind2++;
				phii = phi[i - 1];
				P[ind2 - 1] = V[ind - 1] + phii * phijdt;
				if (j < ir) {
					P[ind2 - 1] += store[j] * phii;
				}
				if (i != ir) {
					ind1++;
					P[ind2 - 1] += store[i] * phij + P[ind1 - 1];
				}//500
			}
		}//500

		//Predict Y

		Y[l - 1] = A[0];
		if (id != 0) {
			for (j = 1; j <= id; ++j) {
				irj = ir + j;
				Y[l - 1] += A[irj - 1] * delta[j - 1];
			}
			//Calculate MSE of Y
		}//520
		AMS = P[0];
		if (id != 0) {
			for (j = 1; j <= id; ++j) {
				jrj = ibc + (j - 1) * (idd2 - j) / 2;
				irj = ir + j;
				AMS += (two * delta[j - 1] * P[irj - 1] + P[jrj] * delta[j - 1] * delta[j - 1]);
			}
			if (id != 1) {
				for (j = 1; j <= id1; ++j) {
					j1 = j + 1;
					jrk = ibc + 1 + (j - 1) * (idd2 - j) / 2;
					for (i = j1; i <= id; ++i) {
						jrk++;
						AMS += two * delta[i-1] * delta[j-1] * P[jrk-1];
					}
				}
			}//550
		}//550
		AMSE[l - 1] = AMS * sigma;

	}//560
	/*
	mdisplay(A, 1, ird);
	mdisplay(P, 1, irz);
	mdisplay(V, 1, np);
	mdisplay(store, 1, ird);
	mdisplay(xrow, 1, np);
	*/
	free(A);
	free(P);
	free(V);
	free(store);
	free(xrow);
	return ifault;
}